

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::RegrSXyState,double,double,duckdb::RegrSXYOperation>
               (double *adata,AggregateInputData *aggr_input_data,double *bdata,
               RegrSXyState **states,idx_t count,SelectionVector *asel,SelectionVector *bsel,
               SelectionVector *ssel,ValidityMask *avalidity,ValidityMask *bvalidity)

{
  double dVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  RegrSXyState *pRVar6;
  unsigned_long *puVar7;
  double dVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t iVar16;
  double dVar17;
  uint64_t uVar21;
  undefined1 auVar18 [16];
  double dVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar27;
  undefined1 auVar26 [16];
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = asel->sel_vector;
      psVar4 = bsel->sel_vector;
      psVar5 = ssel->sel_vector;
      uVar11 = 0;
      do {
        uVar12 = uVar11;
        if (psVar3 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar3[uVar11];
        }
        uVar14 = uVar11;
        if (psVar4 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar4[uVar11];
        }
        uVar9 = uVar11;
        if (psVar5 != (sel_t *)0x0) {
          uVar9 = (ulong)psVar5[uVar11];
        }
        pRVar6 = states[uVar9];
        uVar21 = (pRVar6->cov_pop).count + 1;
        pRVar6->count = pRVar6->count + 1;
        (pRVar6->cov_pop).count = uVar21;
        auVar18._8_4_ = (int)(uVar21 >> 0x20);
        auVar18._0_8_ = uVar21;
        auVar18._12_4_ = 0x45300000;
        dVar17 = (double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0;
        dVar22 = auVar18._8_8_ - 1.9342813113834067e+25;
        dVar1 = adata[uVar12];
        dVar8 = (pRVar6->cov_pop).meanx;
        dVar27 = (pRVar6->cov_pop).meany;
        dVar23 = bdata[uVar14] - dVar8;
        auVar19._0_8_ = dVar22 + dVar17;
        auVar19._8_8_ = dVar22 + dVar17;
        auVar24._8_8_ = dVar1 - dVar27;
        auVar24._0_8_ = dVar23;
        auVar25 = divpd(auVar24,auVar19);
        dVar27 = auVar25._8_8_ + dVar27;
        (pRVar6->cov_pop).meanx = auVar25._0_8_ + dVar8;
        (pRVar6->cov_pop).meany = dVar27;
        (pRVar6->cov_pop).co_moment = (dVar1 - dVar27) * dVar23 + (pRVar6->cov_pop).co_moment;
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
  }
  else if (count != 0) {
    psVar3 = asel->sel_vector;
    psVar4 = bsel->sel_vector;
    psVar5 = ssel->sel_vector;
    puVar7 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar10 = 0;
    do {
      iVar15 = iVar10;
      if (psVar3 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar3[iVar10];
      }
      iVar16 = iVar10;
      if (psVar4 != (sel_t *)0x0) {
        iVar16 = (idx_t)psVar4[iVar10];
      }
      iVar13 = iVar10;
      if (psVar5 != (sel_t *)0x0) {
        iVar13 = (idx_t)psVar5[iVar10];
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0))
         && ((puVar7 == (unsigned_long *)0x0 || ((puVar7[iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0))
            )) {
        pRVar6 = states[iVar13];
        uVar21 = (pRVar6->cov_pop).count + 1;
        pRVar6->count = pRVar6->count + 1;
        (pRVar6->cov_pop).count = uVar21;
        auVar25._8_4_ = (int)(uVar21 >> 0x20);
        auVar25._0_8_ = uVar21;
        auVar25._12_4_ = 0x45300000;
        dVar17 = (double)CONCAT44(0x43300000,(int)uVar21) - 4503599627370496.0;
        dVar22 = auVar25._8_8_ - 1.9342813113834067e+25;
        dVar1 = adata[iVar15];
        dVar8 = (pRVar6->cov_pop).meanx;
        dVar27 = (pRVar6->cov_pop).meany;
        dVar23 = bdata[iVar16] - dVar8;
        auVar20._0_8_ = dVar22 + dVar17;
        auVar20._8_8_ = dVar22 + dVar17;
        auVar26._8_8_ = dVar1 - dVar27;
        auVar26._0_8_ = dVar23;
        auVar25 = divpd(auVar26,auVar20);
        dVar27 = auVar25._8_8_ + dVar27;
        (pRVar6->cov_pop).meanx = auVar25._0_8_ + dVar8;
        (pRVar6->cov_pop).meany = dVar27;
        (pRVar6->cov_pop).co_moment = (dVar1 - dVar27) * dVar23 + (pRVar6->cov_pop).co_moment;
      }
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}